

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O2

bool cmMathCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  char *__format;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string_view value;
  string_view value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  cmExprParserHelper helper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string e;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar9 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"must be called with at least one argument.",(allocator<char> *)&helper)
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001f1f0e:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar3 = std::operator==(pbVar9,"EXPR");
  if (!bVar3) {
    std::operator+(&e,"does not recognize sub-command ",pbVar9);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_001f1f0e;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if ((lVar6 != 3) && (lVar6 != 5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"EXPR called with incorrect arguments.",(allocator<char> *)&helper);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_001f1f0e;
  }
  value._M_str = "ERROR";
  value._M_len = 5;
  cmMakefile::AddDefinition(status->Makefile,pbVar1 + 1,value);
  iVar8 = 0;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x61) goto LAB_001f2013;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"sub-command EXPR ",(allocator<char> *)&helper);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 3;
  bVar3 = std::operator==(pbVar9,"OUTPUT_FORMAT");
  if (bVar3) {
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
      std::operator+(&local_538,&e,"missing argument for option \"");
      std::operator+(&bStack_558,&local_538,pbVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper,
                     &bStack_558,"\".");
      std::__cxx11::string::~string((string *)&bStack_558);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001f1fed;
    }
    __lhs = pbVar2 + 4;
    bVar4 = std::operator==(__lhs,"DECIMAL");
    bVar3 = true;
    if (bVar4) {
      iVar8 = 1;
    }
    else {
      bVar4 = std::operator==(__lhs,"HEXADECIMAL");
      if (!bVar4) {
        std::operator+(&local_478,&e,"value \"");
        std::operator+(&local_458,&local_478,__lhs);
        std::operator+(&local_538,&local_458,"\" for option \"");
        std::operator+(&bStack_558,&local_538,pbVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper,
                       &bStack_558,"\" is invalid.");
        std::__cxx11::string::~string((string *)&bStack_558);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_001f1fed;
      }
      iVar8 = 2;
    }
  }
  else {
    std::operator+(&local_538,&e,"option \"");
    std::operator+(&bStack_558,&local_538,pbVar9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper,
                   &bStack_558,"\" is unknown.");
    std::__cxx11::string::~string((string *)&bStack_558);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001f1fed:
    std::__cxx11::string::~string((string *)&helper);
    iVar8 = 0;
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&e);
  if (!bVar3) {
    return false;
  }
LAB_001f2013:
  cmExprParserHelper::cmExprParserHelper(&helper);
  iVar5 = cmExprParserHelper::ParseString(&helper,pbVar1[2]._M_dataplus._M_p,0);
  if (iVar5 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,helper.ErrorString._M_dataplus._M_p,(allocator<char> *)&bStack_558);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    __format = "%ld";
    if (iVar8 == 2) {
      __format = "0x%lx";
    }
    snprintf((char *)&e,0x400,__format,helper.Result);
    if (helper.WarningString._M_string_length != 0) {
      cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&helper.WarningString);
    }
    this = status->Makefile;
    sVar7 = strlen((char *)&e);
    value_00._M_str = (char *)&e;
    value_00._M_len = sVar7;
    cmMakefile::AddDefinition(this,pbVar1 + 1,value_00);
  }
  cmExprParserHelper::~cmExprParserHelper(&helper);
  return iVar5 != 0;
}

Assistant:

bool cmMathCommand(std::vector<std::string> const& args,
                   cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  const std::string& subCommand = args[0];
  if (subCommand == "EXPR") {
    return HandleExprCommand(args, status);
  }
  std::string e = "does not recognize sub-command " + subCommand;
  status.SetError(e);
  return false;
}